

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

cmd_ln_t * cmd_ln_parse_file_r(ps_config_t *inout_cmdln,ps_arg_t *defn,char *filename,int32 strict)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  char **ppcVar5;
  long lVar6;
  cmd_ln_t *pcVar7;
  char **ppcVar8;
  uint argc;
  ulong uVar9;
  bool bVar10;
  int local_78;
  char *local_70;
  long local_68;
  char separator [5];
  int local_4c;
  
  builtin_strncpy(separator," \t\r\n",5);
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x1b2,"Cannot open configuration file %s for reading\n",filename);
    return (cmd_ln_t *)0x0;
  }
  iVar2 = fgetc(__stream);
  while( true ) {
    if (iVar2 == -1) {
      fclose(__stream);
      return (cmd_ln_t *)0x0;
    }
    pcVar4 = strchr(separator,iVar2);
    if (pcVar4 == (char *)0x0) break;
    iVar2 = fgetc(__stream);
  }
  ppcVar5 = (char **)__ckd_calloc__(0x1e,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                    ,0x1c4);
  local_70 = (char *)__ckd_calloc__(0x201,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                    ,0x1c6);
  iVar1 = 0x200;
  local_4c = 0x1e;
  argc = 0;
  local_78 = 0;
LAB_0010ae87:
  local_68 = 0;
  do {
    iVar3 = (int)local_68;
    if (iVar3 == 0 && (argc & 1) == 0) {
LAB_0010aea8:
      if (iVar2 == 0x23) {
        do {
          iVar2 = fgetc(__stream);
          if (iVar2 == 10) break;
        } while (iVar2 != -1);
        do {
          iVar2 = fgetc(__stream);
          if (iVar2 == -1) break;
          pcVar4 = strchr(separator,iVar2);
        } while (pcVar4 != (char *)0x0);
        goto LAB_0010aea8;
      }
      if (iVar2 == -1) {
        bVar10 = true;
        goto LAB_0010b0a1;
      }
    }
    if ((iVar2 == 0x22) || (iVar2 == 0x27)) {
      if (local_78 == iVar2) {
        local_78 = 0;
      }
      else {
        bVar10 = local_78 != 0;
        local_78 = iVar2;
        if (bVar10) {
          bVar10 = false;
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                  ,0x1dd,"Nesting quotations is not supported!\n");
          goto LAB_0010b0a1;
        }
      }
    }
    else {
      if ((iVar2 == -1) ||
         ((local_78 == 0 && (pcVar4 = strchr(separator,iVar2), pcVar4 != (char *)0x0)))) break;
      if (iVar1 <= iVar3) {
        pcVar4 = (char *)__ckd_realloc__(local_70,(long)(iVar1 * 2 + 1),
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                         ,0x207);
        if (pcVar4 == (char *)0x0) {
          bVar10 = false;
          goto LAB_0010b0a1;
        }
        iVar1 = iVar1 * 2;
        local_70 = pcVar4;
      }
      lVar6 = (long)iVar3;
      local_68 = lVar6 + 1;
      local_70[lVar6] = (char)iVar2;
      local_70[lVar6 + 1] = '\0';
    }
    iVar2 = fgetc(__stream);
  } while( true );
  ppcVar8 = ppcVar5;
  if (local_4c <= (int)argc) {
    local_4c = local_4c * 2;
    ppcVar8 = (char **)__ckd_realloc__(ppcVar5,(long)local_4c << 3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                       ,0x1e9);
    if (ppcVar8 == (char **)0x0) {
      bVar10 = false;
LAB_0010b0a1:
      fclose(__stream);
      ckd_free(local_70);
      if (bVar10) {
        pcVar7 = cmd_ln_parse_r(inout_cmdln,defn,argc,ppcVar5,strict);
        if (pcVar7 != (cmd_ln_t *)0x0) {
          if (pcVar7 == inout_cmdln) {
            ppcVar8 = (char **)__ckd_realloc__(pcVar7->f_argv,(ulong)(pcVar7->f_argc + argc) << 3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                                               ,0x119);
            pcVar7->f_argv = ppcVar8;
            memcpy(ppcVar8 + pcVar7->f_argc,ppcVar5,(long)(int)argc << 3);
            ckd_free(ppcVar5);
            pcVar7->f_argc = pcVar7->f_argc + argc;
            return pcVar7;
          }
          pcVar7->f_argc = argc;
          pcVar7->f_argv = ppcVar5;
          return pcVar7;
        }
        for (uVar9 = 0; argc != uVar9; uVar9 = uVar9 + 1) {
          ckd_free(ppcVar5[uVar9]);
        }
      }
      else {
        for (uVar9 = 0; argc != uVar9; uVar9 = uVar9 + 1) {
          ckd_free(ppcVar5[uVar9]);
        }
      }
      ckd_free(ppcVar5);
      return (cmd_ln_t *)0x0;
    }
  }
  pcVar4 = __ckd_salloc__(local_70,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                          ,0x1f2);
  ppcVar8[argc] = pcVar4;
  *local_70 = '\0';
  if (local_78 != 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
            ,0x1f8,"Unclosed quotation, having EOF close it...\n");
  }
  argc = argc + 1;
  while( true ) {
    ppcVar5 = ppcVar8;
    if (iVar2 == -1) {
      bVar10 = true;
      goto LAB_0010b0a1;
    }
    pcVar4 = strchr(separator,iVar2);
    if (pcVar4 == (char *)0x0) break;
    iVar2 = fgetc(__stream);
  }
  goto LAB_0010ae87;
}

Assistant:

ps_config_t *
cmd_ln_parse_file_r(ps_config_t *inout_cmdln, const ps_arg_t * defn, const char *filename, int32 strict)
{
    FILE *file;
    int argc;
    int argv_size;
    char *str;
    int arg_max_length = 512;
    int len = 0;
    int quoting, ch;
    char **f_argv;
    int rv = 0;
    const char separator[] = " \t\r\n";

    if ((file = fopen(filename, "r")) == NULL) {
        E_ERROR("Cannot open configuration file %s for reading\n",
                filename);
        return NULL;
    }

    ch = fgetc(file);
    /* Skip to the next interesting character */
    for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

    if (ch == EOF) {
        fclose(file);
        return NULL;
    }

    /*
     * Initialize default argv, argc, and argv_size.
     */
    argv_size = 30;
    argc = 0;
    f_argv = (char **)ckd_calloc(argv_size, sizeof(char *));
    /* Silently make room for \0 */
    str = (char* )ckd_calloc(arg_max_length + 1, sizeof(char));
    quoting = 0;

    do {
        /* Handle arguments that are commented out */
        if (len == 0 && argc % 2 == 0) {
            while (ch == '#') {
                /* Skip everything until newline */
                for (ch = fgetc(file); ch != EOF && ch != '\n'; ch = fgetc(file)) ;
                /* Skip to the next interesting character */
                for (ch = fgetc(file); ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;
            }

            /* Check if we are at the last line (without anything interesting in it) */
            if (ch == EOF)
                break;
        }

        /* Handle quoted arguments */
        if (ch == '"' || ch == '\'') {
            if (quoting == ch) /* End a quoted section with the same type */
                quoting = 0;
            else if (quoting) {
                E_ERROR("Nesting quotations is not supported!\n");
                rv = 1;
                break;
            }
            else
                quoting = ch; /* Start a quoted section */
        }
        else if (ch == EOF || (!quoting && strchr(separator, ch))) {
            /* Reallocate argv so it is big enough to contain all the arguments */
            if (argc >= argv_size) {
                char **tmp_argv;
                if (!(tmp_argv =
                       (char **)ckd_realloc(f_argv, argv_size * 2 * sizeof(char *)))) {
                    rv = 1;
                    break;
                }
                f_argv = tmp_argv;
                argv_size *= 2;
            }

            /* Add the string to the list of arguments */
            f_argv[argc] = ckd_salloc(str);
            len = 0;
            str[0] = '\0';
            argc++;

            if (quoting)
                E_WARN("Unclosed quotation, having EOF close it...\n");

            /* Skip to the next interesting character */
            for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

            if (ch == EOF)
                break;

            /* We already have the next character */
            continue;
        }
        else {
            if (len >= arg_max_length) {
                /* Make room for more chars (including the \0 !) */
                char *tmp_str = str;
                if ((tmp_str = (char *)ckd_realloc(str, (1 + arg_max_length * 2) * sizeof(char))) == NULL) {
                    rv = 1;
                    break;
                }
                str = tmp_str;
                arg_max_length *= 2;
            }
            /* Add the char to the argument string */
            str[len++] = ch;
            /* Always null terminate */
            str[len] = '\0';
        }

        ch = fgetc(file);
    } while (1);

    fclose(file);

    ckd_free(str);

    if (rv) {
        for (ch = 0; ch < argc; ++ch)
            ckd_free(f_argv[ch]);
        ckd_free(f_argv);
        return NULL;
    }

    return parse_options(inout_cmdln, defn, argc, f_argv, strict);
}